

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

void serial_try_write(Serial *serial)

{
  Seat *seat;
  size_t sVar1;
  int *piVar2;
  ptrlen pVar3;
  void *local_28;
  ptrlen data;
  ssize_t ret;
  Serial *serial_local;
  
  if (serial->fd < 0) {
    __assert_fail("serial->fd >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/serial.c",
                  0x1b7,"void serial_try_write(Serial *)");
  }
  while (sVar1 = bufchain_size(&serial->output_data), sVar1 != 0) {
    pVar3 = bufchain_prefix(&serial->output_data);
    local_28 = pVar3.ptr;
    data.ptr = (void *)pVar3.len;
    sVar1 = write(serial->fd,local_28,(size_t)data.ptr);
    if (((long)sVar1 < 0) && (piVar2 = __errno_location(), *piVar2 == 0xb)) break;
    if ((long)sVar1 < 0) {
      perror("write serial port");
      exit(1);
    }
    bufchain_consume(&serial->output_data,sVar1);
  }
  seat = serial->seat;
  sVar1 = bufchain_size(&serial->output_data);
  seat_sent(seat,sVar1);
  serial_uxsel_setup(serial);
  return;
}

Assistant:

static void serial_try_write(Serial *serial)
{
    ssize_t ret;

    assert(serial->fd >= 0);

    while (bufchain_size(&serial->output_data) > 0) {
        ptrlen data = bufchain_prefix(&serial->output_data);
        ret = write(serial->fd, data.ptr, data.len);

        if (ret < 0 && (errno == EWOULDBLOCK)) {
            /*
             * We've sent all we can for the moment.
             */
            break;
        }
        if (ret < 0) {
            perror("write serial port");
            exit(1);
        }
        bufchain_consume(&serial->output_data, ret);
    }

    seat_sent(serial->seat, bufchain_size(&serial->output_data));
    serial_uxsel_setup(serial);
}